

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

bool __thiscall Matrix::bShapeEqual(Matrix *this,Matrix *m)

{
  ostream *poVar1;
  int local_20;
  bool local_19;
  int i;
  bool ok;
  Matrix *m_local;
  Matrix *this_local;
  
  local_19 = true;
  if (this->nMatrixDimension == m->nMatrixDimension) {
    for (local_20 = 0; local_20 < this->nMatrixDimension; local_20 = local_20 + 1) {
      if (this->pSize[local_20] != m->pSize[local_20]) {
        poVar1 = std::operator<<((ostream *)&std::cout,"error: size mismatch at dimension ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
        poVar1 = std::operator<<(poVar1," in matrix operation ");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        local_19 = false;
      }
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "error: dimensionality mismatch in matrix operation ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool Matrix::bShapeEqual( const Matrix &m )
{
	bool ok = true;
	// check shape
	if( nMatrixDimension != m.nMatrixDimension ) {
		cout << "error: dimensionality mismatch in matrix operation " << endl;
		ok = false;
	} else {
		for(int i=0; i<nMatrixDimension; i++)
			if( pSize[i] != m.pSize[i] ) {
				cout << "error: size mismatch at dimension " << i << " in matrix operation " << endl;
				ok = false;
			}
	}
	return ok;
}